

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
llvm::SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>::grow
          (SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false> *this,
          size_t MinSize)

{
  uint uVar1;
  void *pvVar2;
  SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false> *__ptr;
  uint64_t uVar3;
  void *pvVar4;
  long lVar5;
  
  if (MinSize >> 0x20 != 0) {
    report_bad_alloc_error("SmallVector capacity overflow during allocation",true);
  }
  uVar3 = NextPowerOf2((ulong)(this->
                              super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
                              ).super_SmallVectorBase.Capacity + 2);
  if (MinSize < uVar3) {
    MinSize = uVar3;
  }
  if (0xfffffffe < MinSize) {
    MinSize = 0xffffffff;
  }
  pvVar4 = safe_malloc(MinSize * 4);
  pvVar2 = (this->
           super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>).
           super_SmallVectorBase.BeginX;
  uVar1 = (this->super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
          ).super_SmallVectorBase.Size;
  for (lVar5 = 0; (ulong)uVar1 << 2 != lVar5; lVar5 = lVar5 + 4) {
    *(undefined4 *)((long)pvVar4 + lVar5) = *(undefined4 *)((long)pvVar2 + lVar5);
  }
  __ptr = (SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false> *)
          (this->super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>
          ).super_SmallVectorBase.BeginX;
  if (__ptr != this + 1) {
    free(__ptr);
  }
  (this->super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>).
  super_SmallVectorBase.BeginX = pvVar4;
  (this->super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>).
  super_SmallVectorBase.Capacity = (uint)MinSize;
  return;
}

Assistant:

void SmallVectorTemplateBase<T, TriviallyCopyable>::grow(size_t MinSize) {
  if (MinSize > UINT32_MAX)
    report_bad_alloc_error("SmallVector capacity overflow during allocation");

  // Always grow, even from zero.
  size_t NewCapacity = size_t(NextPowerOf2(this->capacity() + 2));
  NewCapacity = std::min(std::max(NewCapacity, MinSize), size_t(UINT32_MAX));
  T *NewElts = static_cast<T*>(llvm::safe_malloc(NewCapacity*sizeof(T)));

  // Move the elements over.
  this->uninitialized_move(this->begin(), this->end(), NewElts);

  // Destroy the original elements.
  destroy_range(this->begin(), this->end());

  // If this wasn't grown from the inline copy, deallocate the old space.
  if (!this->isSmall())
    free(this->begin());

  this->BeginX = NewElts;
  this->Capacity = NewCapacity;
}